

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O3

void __thiscall
cmProcess::cmProcess
          (cmProcess *this,unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner)

{
  (this->Timeout).
  super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>._M_payload.
  super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>._M_engaged =
       false;
  this->TimeoutReason_ = Normal;
  (this->StartTime).__d.__r = 0;
  this->ReadHandleClosed = false;
  this->ProcessHandleClosed = false;
  (this->Process).super_uv_handle_ptr_<uv_process_s>.super_uv_handle_ptr_base_<uv_process_s>.handle.
  super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Process).super_uv_handle_ptr_<uv_process_s>.super_uv_handle_ptr_base_<uv_process_s>.handle.
  super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->PipeReader).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->PipeReader).super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Timer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Timer).super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Runner)._M_t.super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
  _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
  super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
       (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>.
       _M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
       super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl;
  (runner->_M_t).super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
  super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
  super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl = (cmCTestRunTest *)0x0;
  cmProcessOutput::cmProcessOutput(&this->Conv,UTF8,0x10000);
  this->Signal = 0;
  this->ProcessState = Starting;
  (this->Output).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->Output).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->Output).super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->Output).First = 0;
  (this->Output).Last = 0;
  (this->Command)._M_dataplus._M_p = (pointer)&(this->Command).field_2;
  (this->Command)._M_string_length = 0;
  (this->Command).field_2._M_local_buf[0] = '\0';
  (this->WorkingDirectory)._M_dataplus._M_p = (pointer)&(this->WorkingDirectory).field_2;
  (this->WorkingDirectory)._M_string_length = 0;
  (this->WorkingDirectory).field_2._M_local_buf[0] = '\0';
  this->TerminationStyle = Normal;
  this->ExitValue = 0;
  (this->StartTime).__d.__r = 0;
  (this->TotalTime).__r = 0.0;
  this->Id = 0;
  (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

cmProcess::cmProcess(std::unique_ptr<cmCTestRunTest> runner)
  : Runner(std::move(runner))
  , Conv(cmProcessOutput::UTF8, CM_PROCESS_BUF_SIZE)
{
  this->TotalTime = cmDuration::zero();
  this->ExitValue = 0;
  this->Id = 0;
  this->StartTime = std::chrono::steady_clock::time_point();
}